

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextFile.cpp
# Opt level: O2

Array<asl::String> __thiscall asl::TextFile::lines(TextFile *this)

{
  FILE *pFVar1;
  bool bVar2;
  int iVar3;
  int __oflag;
  TextFile *in_RSI;
  String local_28;
  
  Array<asl::String>::Array((Array<asl::String> *)this);
  if (((in_RSI->super_File)._file == (FILE *)0x0) &&
     (iVar3 = open(in_RSI,(char *)0x0,__oflag), (char)iVar3 == '\0')) {
    return (Array<asl::String>)(String *)this;
  }
  while (bVar2 = end(in_RSI), !bVar2) {
    local_28.field_2._space[0] = '\0';
    local_28._size = 0;
    local_28._len = 0;
    Array<asl::String>::operator<<((Array<asl::String> *)this,&local_28);
    String::~String(&local_28);
    pFVar1 = (this->super_File)._file;
    readLine(in_RSI,(String *)(pFVar1 + (long)*(int *)(pFVar1 + -0x10) * 0x18 + -0x18));
  }
  return (Array<asl::String>)(String *)this;
}

Assistant:

Array<String> TextFile::lines()
{
	Array<String> lines;
	if(!_file && !open(READ))
		return lines;
	while (!end()) {
		lines << String();
		readLine(lines.last());
	}
	return lines;
}